

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_LT_Test::
iu_GTestSyntaxTest_x_iutest_x_LT_Test(iu_GTestSyntaxTest_x_iutest_x_LT_Test *this)

{
  iu_GTestSyntaxTest_x_iutest_x_LT_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_GTestSyntaxTest_x_iutest_x_LT_Test_0062aa40
  ;
  return;
}

Assistant:

TEST(GTestSyntaxTest, LT)
{
    if( int x = 1 )
        ASSERT_LT(0, x) << x;
    if( int x = 1 )
        EXPECT_LT(0, x) << x;
    if( int x = 1 )
        INFORM_LT(0, x) << x;
    if( int x = 1 )
        ASSUME_LT(0, x) << x;
}